

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjectCreation.h
# Opt level: O2

Expression * CreateObject(PrimitiveSimpleObject *object)

{
  EseqExpression *this;
  int value;
  ExpressionList *this_00;
  ConstExpression *this_01;
  CallExpression *this_02;
  NameExpression *this_03;
  TempExpression *this_04;
  allocator<char> local_e9;
  MoveStatement *local_e8;
  TempExpression *local_e0;
  EseqExpression *local_d8;
  Temporary tmp;
  Temporary local_b0;
  string local_90;
  Label local_70;
  Temporary local_50;
  
  this_00 = (ExpressionList *)operator_new(0x20);
  (this_00->super_BaseElement)._vptr_BaseElement = (_func_int **)&PTR__ExpressionList_00161f48;
  (this_00->expressions_).super__Vector_base<IRT::Expression_*,_std::allocator<IRT::Expression_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this_00->expressions_).super__Vector_base<IRT::Expression_*,_std::allocator<IRT::Expression_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this_00->expressions_).super__Vector_base<IRT::Expression_*,_std::allocator<IRT::Expression_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_01 = (ConstExpression *)operator_new(0x10);
  value = (*(object->super_PrimitiveObject).super_Object._vptr_Object[3])(object);
  IRT::ConstExpression::ConstExpression(this_01,value);
  IRT::ExpressionList::Add(this_00,(Expression *)this_01);
  IRT::Temporary::Temporary(&tmp);
  local_d8 = (EseqExpression *)operator_new(0x18);
  local_e8 = (MoveStatement *)operator_new(0x18);
  local_e0 = (TempExpression *)operator_new(0x28);
  std::__cxx11::string::string((string *)&local_50,(string *)&tmp);
  IRT::TempExpression::TempExpression(local_e0,&local_50);
  this_02 = (CallExpression *)operator_new(0x18);
  this_03 = (NameExpression *)operator_new(0x28);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"malloc",&local_e9);
  IRT::Label::Label(&local_70,&local_90);
  IRT::NameExpression::NameExpression(this_03,&local_70);
  IRT::CallExpression::CallExpression(this_02,(Expression *)this_03,this_00);
  IRT::MoveStatement::MoveStatement(local_e8,&local_e0->super_Expression,(Expression *)this_02);
  this_04 = (TempExpression *)operator_new(0x28);
  std::__cxx11::string::string((string *)&local_b0,(string *)&tmp);
  this = local_d8;
  IRT::TempExpression::TempExpression(this_04,&local_b0);
  IRT::EseqExpression::EseqExpression(this,&local_e8->super_Statement,(Expression *)this_04);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&tmp);
  return &this->super_Expression;
}

Assistant:

IRT::Expression* CreateObject(PrimitiveSimpleObject* object) {
  auto* irt_expressions = new IRT::ExpressionList();
  irt_expressions->Add(new IRT::ConstExpression(object->GetSize()));

  IRT::Temporary tmp;
  return new IRT::EseqExpression(
      new IRT::MoveStatement(
          new IRT::TempExpression(tmp),
          new IRT::CallExpression(new IRT::NameExpression(IRT::Label("malloc")),
                                  irt_expressions)),
      new IRT::TempExpression(tmp));
}